

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_7ad8::GetAperiodicRatio
               (double current_time,double frame_period,int f0_length,double **aperiodicity,
               int fft_size,double *aperiodic_spectrum)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_50;
  int local_4c;
  int i_1;
  int i;
  double interpolation;
  int current_frame_ceil;
  int current_frame_floor;
  double *aperiodic_spectrum_local;
  int fft_size_local;
  double **aperiodicity_local;
  int f0_length_local;
  double frame_period_local;
  double current_time_local;
  
  dVar3 = floor(current_time / frame_period);
  iVar1 = MyMinInt(f0_length + -1,(int)dVar3);
  dVar3 = ceil(current_time / frame_period);
  iVar2 = MyMinInt(f0_length + -1,(int)dVar3);
  dVar3 = current_time / frame_period - (double)iVar1;
  if (iVar1 == iVar2) {
    for (local_4c = 0; local_4c <= fft_size / 2; local_4c = local_4c + 1) {
      dVar3 = GetSafeAperiodicity(aperiodicity[iVar1][local_4c]);
      dVar3 = pow(dVar3,2.0);
      aperiodic_spectrum[local_4c] = dVar3;
    }
  }
  else {
    for (local_50 = 0; local_50 <= fft_size / 2; local_50 = local_50 + 1) {
      dVar4 = GetSafeAperiodicity(aperiodicity[iVar1][local_50]);
      dVar5 = GetSafeAperiodicity(aperiodicity[iVar2][local_50]);
      dVar4 = pow((1.0 - dVar3) * dVar4 + dVar3 * dVar5,2.0);
      aperiodic_spectrum[local_50] = dVar4;
    }
  }
  return;
}

Assistant:

static void GetAperiodicRatio(double current_time, double frame_period,
    int f0_length, const double * const *aperiodicity, int fft_size,
    double *aperiodic_spectrum) {
  int current_frame_floor = MyMinInt(f0_length - 1,
    static_cast<int>(floor(current_time / frame_period)));
  int current_frame_ceil = MyMinInt(f0_length - 1,
    static_cast<int>(ceil(current_time / frame_period)));
  double interpolation = current_time / frame_period - current_frame_floor;

  if (current_frame_floor == current_frame_ceil)
    for (int i = 0; i <= fft_size / 2; ++i)
      aperiodic_spectrum[i] =
        pow(GetSafeAperiodicity(aperiodicity[current_frame_floor][i]), 2.0);
  else
    for (int i = 0; i <= fft_size / 2; ++i)
      aperiodic_spectrum[i] = pow((1.0 - interpolation) *
          GetSafeAperiodicity(aperiodicity[current_frame_floor][i]) +
          interpolation *
          GetSafeAperiodicity(aperiodicity[current_frame_ceil][i]), 2.0);
}